

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_dehexify.c
# Opt level: O3

void * x11_dehexify(ptrlen hexpl,int *outlen)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  char bytestr [3];
  uint val;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined4 local_44;
  ulong local_40;
  int *local_38;
  
  local_40 = hexpl.len >> 1;
  iVar2 = (int)local_40;
  local_38 = outlen;
  pvVar1 = safemalloc((long)iVar2,1,0);
  if (0 < iVar2) {
    uVar4 = (uint)local_40;
    uVar3 = 0;
    do {
      local_44 = 0;
      local_47 = *(undefined1 *)((long)hexpl.ptr + uVar3 * 2);
      local_46 = *(undefined1 *)((long)hexpl.ptr + uVar3 * 2 + 1);
      local_45 = 0;
      __isoc99_sscanf(&local_47,"%x",&local_44);
      *(undefined1 *)((long)pvVar1 + uVar3) = (undefined1)local_44;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  *local_38 = (int)local_40;
  return pvVar1;
}

Assistant:

void *x11_dehexify(ptrlen hexpl, int *outlen)
{
    int len, i;
    unsigned char *ret;

    len = hexpl.len / 2;
    ret = snewn(len, unsigned char);

    for (i = 0; i < len; i++) {
        char bytestr[3];
        unsigned val = 0;
        bytestr[0] = ((const char *)hexpl.ptr)[2*i];
        bytestr[1] = ((const char *)hexpl.ptr)[2*i+1];
        bytestr[2] = '\0';
        sscanf(bytestr, "%x", &val);
        ret[i] = val;
    }

    *outlen = len;
    return ret;
}